

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_Init(void *arkode_mem,int init_type)

{
  int iVar1;
  ARKodeHAdaptMem pAVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ARKodeButcherTable pAVar6;
  N_Vector *pp_Var7;
  realtype *prVar8;
  long lVar9;
  char *msgfmt;
  long lVar10;
  size_t __nmemb;
  bool bVar11;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar5 = arkStep_AccessStepMem(arkode_mem,"arkStep_Init",&ark_mem,&step_mem);
  if (iVar5 != 0) {
    return iVar5;
  }
  if (init_type == 1) {
    return 0;
  }
  if (init_type == 0) {
    bVar11 = ark_mem->fixedstep != 0;
    bVar3 = step_mem->implicit == 0;
    bVar4 = ark_mem->user_efun == 0;
    if (ark_mem->rwt_is_ewt == 0) {
      if ((bVar3 && bVar4) && bVar11) goto LAB_0049a24a;
    }
    else if (step_mem->msolve_type - SUNLINEARSOLVER_MATRIX_EMBEDDED < 0xfffffffe &&
             ((bVar3 && bVar4) && bVar11)) {
LAB_0049a24a:
      ark_mem->user_efun = 0;
      ark_mem->efun = arkEwtSetSmallReal;
      ark_mem->e_data = ark_mem;
    }
    iVar5 = arkStep_SetButcherTables(ark_mem);
    if (iVar5 == 0) {
      iVar5 = arkStep_CheckButcherTables(ark_mem);
      if (iVar5 == 0) {
        pAVar6 = step_mem->Bi;
        if (pAVar6 == (ARKodeButcherTable)0x0) {
          pAVar6 = step_mem->Be;
        }
        iVar5 = pAVar6->q;
        pAVar2 = ark_mem->hadapt_mem;
        pAVar2->q = iVar5;
        iVar1 = pAVar6->p;
        pAVar2->p = iVar1;
        step_mem->q = iVar5;
        step_mem->p = iVar1;
        if (iVar1 == 0 && ark_mem->fixedstep == 0) {
          msgfmt = "Adaptive timestepping cannot be performed without embedding coefficients";
        }
        else {
          if (step_mem->explicit != 0) {
            if (step_mem->Fe == (N_Vector *)0x0) {
              pp_Var7 = (N_Vector *)calloc((long)step_mem->stages,8);
              step_mem->Fe = pp_Var7;
            }
            lVar10 = -1;
            lVar9 = 0;
            while( true ) {
              lVar10 = lVar10 + 1;
              if (step_mem->stages <= lVar10) break;
              iVar5 = arkAllocVec(ark_mem,ark_mem->ewt,(N_Vector *)(lVar9 + (long)step_mem->Fe));
              lVar9 = lVar9 + 8;
              if (iVar5 == 0) {
                return -0x14;
              }
            }
            ark_mem->liw = ark_mem->liw + (long)step_mem->stages;
          }
          if (step_mem->implicit == 0) {
            iVar5 = step_mem->stages;
          }
          else {
            if (step_mem->Fi == (N_Vector *)0x0) {
              pp_Var7 = (N_Vector *)calloc((long)step_mem->stages,8);
              step_mem->Fi = pp_Var7;
            }
            lVar10 = -1;
            lVar9 = 0;
            while( true ) {
              iVar5 = step_mem->stages;
              lVar10 = lVar10 + 1;
              if (iVar5 <= lVar10) break;
              iVar5 = arkAllocVec(ark_mem,ark_mem->ewt,(N_Vector *)(lVar9 + (long)step_mem->Fi));
              lVar9 = lVar9 + 8;
              if (iVar5 == 0) {
                return -0x14;
              }
            }
            ark_mem->liw = ark_mem->liw + (long)iVar5;
          }
          __nmemb = (long)step_mem->nforcing + (long)iVar5 * 2 + 2;
          iVar5 = (int)__nmemb;
          step_mem->nfusedopvecs = iVar5;
          if (step_mem->cvals == (realtype *)0x0) {
            prVar8 = (realtype *)calloc(__nmemb,8);
            step_mem->cvals = prVar8;
            if (prVar8 == (realtype *)0x0) {
              return -0x14;
            }
            ark_mem->lrw = ark_mem->lrw + __nmemb;
          }
          if (step_mem->Xvecs == (N_Vector *)0x0) {
            pp_Var7 = (N_Vector *)calloc((long)iVar5,8);
            step_mem->Xvecs = pp_Var7;
            if (pp_Var7 == (N_Vector *)0x0) {
              return -0x14;
            }
            ark_mem->liw = ark_mem->liw + (long)iVar5;
          }
          if ((ark_mem->interp == (ARKInterp)0x0) ||
             (iVar5 = arkInterpSetDegree(ark_mem,ark_mem->interp,1 - step_mem->q), iVar5 == 0)) {
            if (step_mem->mass_type != 0) {
              if ((step_mem->predictor & 0xfffffffeU) == 4) {
                step_mem->predictor = 0;
              }
              ark_mem->step = arkStep_TakeStep_Z;
              goto LAB_0049a2ac;
            }
            if (step_mem->predictor == 4) {
              ark_mem->call_fullrhs = 1;
            }
            ark_mem->step = arkStep_TakeStep_Z;
            goto LAB_0049a5b7;
          }
          msgfmt = "Unable to update interpolation polynomial degree";
        }
      }
      else {
        msgfmt = "Error in Butcher table(s)";
      }
    }
    else {
      msgfmt = "Could not create Butcher table(s)";
    }
LAB_0049a3e6:
    iVar5 = -0x16;
  }
  else {
    iVar5 = step_mem->mass_type;
    ark_mem->step = arkStep_TakeStep_Z;
    if (iVar5 != 0) {
LAB_0049a2ac:
      if ((step_mem->lmem != (void *)0x0) && (step_mem->lsolve_type != step_mem->msolve_type)) {
        msgfmt = "Incompatible linear and mass matrix solvers";
        goto LAB_0049a3e6;
      }
      if ((step_mem->minit != (ARKMassInitFn)0x0) &&
         (iVar5 = (*step_mem->minit)(ark_mem), iVar5 != 0)) {
        msgfmt = "The mass matrix solver\'s init routine failed.";
        iVar5 = -0xe;
        goto LAB_0049a3e8;
      }
      if ((step_mem->msetup != (ARKMassSetupFn)0x0) &&
         (iVar5 = (*step_mem->msetup)(ark_mem,ark_mem->tcur,ark_mem->tempv1,ark_mem->tempv2,
                                      ark_mem->tempv3), iVar5 != 0)) {
        msgfmt = "The mass matrix solver\'s setup routine failed.";
        iVar5 = -0xf;
        goto LAB_0049a3e8;
      }
    }
LAB_0049a5b7:
    if ((step_mem->linit == (ARKLinsolInitFn)0x0) ||
       (iVar5 = (*step_mem->linit)(ark_mem), iVar5 == 0)) {
      if (step_mem->NLS == (SUNNonlinearSolver)0x0) {
        return 0;
      }
      iVar5 = arkStep_NlsInit(ark_mem);
      if (iVar5 == 0) {
        return 0;
      }
      msgfmt = "Unable to initialize SUNNonlinearSolver object";
      iVar5 = -0x1d;
    }
    else {
      msgfmt = "The linear solver\'s init routine failed.";
      iVar5 = -5;
    }
  }
LAB_0049a3e8:
  arkProcessError(ark_mem,iVar5,"ARKode::ARKStep","arkStep_Init",msgfmt);
  return iVar5;
}

Assistant:

int arkStep_Init(void* arkode_mem, int init_type)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int j, retval;
  booleantype reset_efun;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_Init",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* immediately return if reset */
  if (init_type == RESET_INIT) return(ARK_SUCCESS);

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT) {

    /* enforce use of arkEwtSmallReal if using a fixed step size for
       an explicit method, an internal error weight function, and not
       using an iterative mass matrix solver with rwt=ewt */
    reset_efun = SUNTRUE;
    if ( step_mem->implicit )   reset_efun = SUNFALSE;
    if ( !ark_mem->fixedstep )  reset_efun = SUNFALSE;
    if ( ark_mem->user_efun )   reset_efun = SUNFALSE;
    if ( ark_mem->rwt_is_ewt && (step_mem->msolve_type == SUNLINEARSOLVER_ITERATIVE) )
      reset_efun = SUNFALSE;
    if ( ark_mem->rwt_is_ewt && (step_mem->msolve_type == SUNLINEARSOLVER_MATRIX_ITERATIVE) )
      reset_efun = SUNFALSE;
    if (reset_efun) {
      ark_mem->user_efun = SUNFALSE;
      ark_mem->efun      = arkEwtSetSmallReal;
      ark_mem->e_data    = ark_mem;
    }

    /* Create Butcher tables (if not already set) */
    retval = arkStep_SetButcherTables(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                      "Could not create Butcher table(s)");
      return(ARK_ILL_INPUT);
    }

    /* Check that Butcher tables are OK */
    retval = arkStep_CheckButcherTables(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_Init", "Error in Butcher table(s)");
      return(ARK_ILL_INPUT);
    }

    /* Retrieve/store method and embedding orders now that tables are finalized */
    if (step_mem->Bi != NULL) {
      step_mem->q = ark_mem->hadapt_mem->q = step_mem->Bi->q;
      step_mem->p = ark_mem->hadapt_mem->p = step_mem->Bi->p;
    } else {
      step_mem->q = ark_mem->hadapt_mem->q = step_mem->Be->q;
      step_mem->p = ark_mem->hadapt_mem->p = step_mem->Be->p;
    }

    /* Ensure that if adaptivity is enabled, then method includes embedding coefficients */
    if (!ark_mem->fixedstep && (step_mem->p == 0)) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                      "Adaptive timestepping cannot be performed without embedding coefficients");
      return(ARK_ILL_INPUT);
    }

    /* Allocate ARK RHS vector memory, update storage requirements */
    /*   Allocate Fe[0] ... Fe[stages-1] if needed */
    if (step_mem->explicit) {
      if (step_mem->Fe == NULL)
        step_mem->Fe = (N_Vector *) calloc(step_mem->stages, sizeof(N_Vector));
      for (j=0; j<step_mem->stages; j++) {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->Fe[j])))
          return(ARK_MEM_FAIL);
      }
      ark_mem->liw += step_mem->stages;  /* pointers */
    }

    /*   Allocate Fi[0] ... Fi[stages-1] if needed */
    if (step_mem->implicit) {
      if (step_mem->Fi == NULL)
        step_mem->Fi = (N_Vector *) calloc(step_mem->stages, sizeof(N_Vector));
      for (j=0; j<step_mem->stages; j++) {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->Fi[j])))
          return(ARK_MEM_FAIL);
      }
      ark_mem->liw += step_mem->stages;  /* pointers */
    }

    /* Allocate reusable arrays for fused vector operations */
    step_mem->nfusedopvecs = 2 * step_mem->stages + 2 + step_mem->nforcing;
    if (step_mem->cvals == NULL) {
      step_mem->cvals = (realtype *) calloc(step_mem->nfusedopvecs,
                                            sizeof(realtype));
      if (step_mem->cvals == NULL)  return(ARK_MEM_FAIL);
      ark_mem->lrw += step_mem->nfusedopvecs;
    }
    if (step_mem->Xvecs == NULL) {
      step_mem->Xvecs = (N_Vector *) calloc(step_mem->nfusedopvecs,
                                            sizeof(N_Vector));
      if (step_mem->Xvecs == NULL)  return(ARK_MEM_FAIL);
      ark_mem->liw += step_mem->nfusedopvecs;   /* pointers */
    }

    /* Limit interpolant degree based on method order (use negative
       argument to specify update instead of overwrite) */
    if (ark_mem->interp != NULL) {
      retval = arkInterpSetDegree(ark_mem, ark_mem->interp, -(step_mem->q-1));
      if (retval != ARK_SUCCESS) {
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                        "Unable to update interpolation polynomial degree");
        return(ARK_ILL_INPUT);
      }
    }

    /* If configured with either predictor 4 or 5 and a non-identity mass
       matrix, reset to trivial predictor */
    if (step_mem->mass_type != MASS_IDENTITY)
      if ((step_mem->predictor == 4) || (step_mem->predictor == 5))
        step_mem->predictor = 0;

    /* If the bootstrap predictor is enabled, signal to shared arkode module that
       fullrhs is required after each step */
    if (step_mem->predictor == 4)  ark_mem->call_fullrhs = SUNTRUE;
  }

  /* set appropriate TakeStep routine based on problem configuration */
  /*    (only one choice for now) */
  ark_mem->step = arkStep_TakeStep_Z;

  /* Check for consistency between mass system and system linear system modules
     (e.g., if lsolve is direct, msolve needs to match) */
  if ((step_mem->mass_type != MASS_IDENTITY) && step_mem->lmem) {
    if (step_mem->lsolve_type != step_mem->msolve_type) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                      "Incompatible linear and mass matrix solvers");
      return(ARK_ILL_INPUT);
    }
  }

  /* Perform mass matrix solver initialization and setup (if applicable) */
  if (step_mem->mass_type != MASS_IDENTITY) {

    /* Call minit (if it exists) */
    if (step_mem->minit != NULL) {
      retval = step_mem->minit((void *) ark_mem);
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_MASSINIT_FAIL, "ARKode::ARKStep",
                        "arkStep_Init", MSG_ARK_MASSINIT_FAIL);
        return(ARK_MASSINIT_FAIL);
      }
    }

    /* Call msetup (if it exists) */
    if (step_mem->msetup != NULL) {
      retval = step_mem->msetup((void *) ark_mem, ark_mem->tcur,
                                ark_mem->tempv1, ark_mem->tempv2,
                                ark_mem->tempv3);
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_MASSSETUP_FAIL, "ARKode::ARKStep",
                        "arkStep_Init", MSG_ARK_MASSSETUP_FAIL);
        return(ARK_MASSSETUP_FAIL);
      }
    }
  }

  /* Call linit (if it exists) */
  if (step_mem->linit) {
    retval = step_mem->linit(ark_mem);
    if (retval != 0) {
      arkProcessError(ark_mem, ARK_LINIT_FAIL, "ARKode::ARKStep",
                      "arkStep_Init", MSG_ARK_LINIT_FAIL);
      return(ARK_LINIT_FAIL);
    }
  }

  /* Initialize the nonlinear solver object (if it exists) */
  if (step_mem->NLS) {
    retval = arkStep_NlsInit(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_NLS_INIT_FAIL, "ARKode::ARKStep", "arkStep_Init",
                      "Unable to initialize SUNNonlinearSolver object");
      return(ARK_NLS_INIT_FAIL);
    }
  }

  return(ARK_SUCCESS);
}